

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF_json.cc
# Opt level: O3

void __thiscall QPDF::JSONReactor::containerEnd(JSONReactor *this,JSON *value)

{
  state_e sVar1;
  pointer pSVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  byte bVar3;
  pointer pSVar4;
  qpdf_offset_t qVar5;
  string local_48;
  
  pSVar2 = (this->stack).
           super__Vector_base<QPDF::JSONReactor::StackFrame,_std::allocator<QPDF::JSONReactor::StackFrame>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  pSVar4 = pSVar2 + -1;
  sVar1 = pSVar2[-1].state;
  (this->stack).
  super__Vector_base<QPDF::JSONReactor::StackFrame,_std::allocator<QPDF::JSONReactor::StackFrame>_>.
  _M_impl.super__Vector_impl_data._M_finish = pSVar4;
  this_00 = pSVar2[-1].object.super_BaseHandle.obj.
            super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
    pSVar4 = (this->stack).
             super__Vector_base<QPDF::JSONReactor::StackFrame,_std::allocator<QPDF::JSONReactor::StackFrame>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  }
  if ((this->stack).
      super__Vector_base<QPDF::JSONReactor::StackFrame,_std::allocator<QPDF::JSONReactor::StackFrame>_>
      ._M_impl.super__Vector_impl_data._M_start == pSVar4) {
    if (this->saw_qpdf == false) {
      local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_48,"\"qpdf\" object was not seen","");
      error(this,0,&local_48);
    }
    else {
      if (this->saw_json_version == false) {
        local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_48,"\"qpdf[0].jsonversion\" was not seen","");
        error(this,0,&local_48);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_48._M_dataplus._M_p != &local_48.field_2) {
          operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
        }
      }
      if ((this->must_be_complete == true) && (this->saw_pdf_version == false)) {
        local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_48,"\"qpdf[0].pdfversion\" was not seen","");
        error(this,0,&local_48);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_48._M_dataplus._M_p != &local_48.field_2) {
          operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
        }
      }
      if (this->saw_objects == false) {
        local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_48,"\"qpdf[1]\" was not seen","");
        error(this,0,&local_48);
      }
      else {
        if ((this->must_be_complete != true) || (this->saw_trailer != false)) goto LAB_0020d8c0;
        local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_48,"\"qpdf[1].trailer\" was not seen","");
        error(this,0,&local_48);
      }
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p == &local_48.field_2) goto LAB_0020d8c0;
  }
  else {
    if (sVar1 == st_object_top) {
      bVar3 = this->saw_stream;
      if (this->saw_value == (bool)bVar3) {
        qVar5 = JSON::getStart(value);
        local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_48,"object must have exactly one of \"value\" or \"stream\"","")
        ;
        error(this,qVar5,&local_48);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_48._M_dataplus._M_p != &local_48.field_2) {
          operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
        }
        bVar3 = this->saw_stream;
      }
      if ((bVar3 & 1) == 0) goto LAB_0020d8c0;
      if (this->saw_dict == false) {
        qVar5 = JSON::getStart(value);
        local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_48,"\"stream\" is missing \"dict\"","");
        error(this,qVar5,&local_48);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_48._M_dataplus._M_p != &local_48.field_2) {
          operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
        }
      }
      if (this->saw_data != this->saw_datafile) goto LAB_0020d8c0;
      if (this->this_stream_needs_data == true) {
        qVar5 = JSON::getStart(value);
        local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_48,
                   "new \"stream\" must have exactly one of \"data\" or \"datafile\"","");
        error(this,qVar5,&local_48);
      }
      else {
        if (this->saw_datafile == false) goto LAB_0020d8c0;
        qVar5 = JSON::getStart(value);
        local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_48,
                   "existing \"stream\" may at most one of \"data\" or \"datafile\"","");
        error(this,qVar5,&local_48);
      }
    }
    else {
      if ((sVar1 != st_trailer) || (this->saw_value != false)) goto LAB_0020d8c0;
      qVar5 = JSON::getStart(value);
      local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_48,"\"trailer\" is missing \"value\"","");
      error(this,qVar5,&local_48);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p == &local_48.field_2) goto LAB_0020d8c0;
  }
  operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
LAB_0020d8c0:
  pSVar4 = (this->stack).
           super__Vector_base<QPDF::JSONReactor::StackFrame,_std::allocator<QPDF::JSONReactor::StackFrame>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (((this->stack).
       super__Vector_base<QPDF::JSONReactor::StackFrame,_std::allocator<QPDF::JSONReactor::StackFrame>_>
       ._M_impl.super__Vector_impl_data._M_start != pSVar4) && (pSVar4[-1].state == st_objects)) {
    std::__cxx11::string::_M_replace
              ((ulong)&this->cur_object,0,(char *)(this->cur_object)._M_string_length,0x27bda8);
    this->saw_value = false;
    this->saw_stream = false;
    this->saw_dict = false;
    this->saw_data = false;
    this->saw_datafile = false;
  }
  return;
}

Assistant:

void
QPDF::JSONReactor::containerEnd(JSON const& value)
{
    auto from_state = stack.back().state;
    stack.pop_back();
    if (stack.empty()) {
        if (!this->saw_qpdf) {
            QTC::TC("qpdf", "QPDF_json missing qpdf");
            error(0, "\"qpdf\" object was not seen");
        } else {
            if (!this->saw_json_version) {
                QTC::TC("qpdf", "QPDF_json missing json version");
                error(0, "\"qpdf[0].jsonversion\" was not seen");
            }
            if (must_be_complete && !this->saw_pdf_version) {
                QTC::TC("qpdf", "QPDF_json missing pdf version");
                error(0, "\"qpdf[0].pdfversion\" was not seen");
            }
            if (!this->saw_objects) {
                QTC::TC("qpdf", "QPDF_json missing objects");
                error(0, "\"qpdf[1]\" was not seen");
            } else {
                if (must_be_complete && !this->saw_trailer) {
                    QTC::TC("qpdf", "QPDF_json missing trailer");
                    error(0, "\"qpdf[1].trailer\" was not seen");
                }
            }
        }
    } else if (from_state == st_trailer) {
        if (!saw_value) {
            QTC::TC("qpdf", "QPDF_json trailer no value");
            error(value.getStart(), "\"trailer\" is missing \"value\"");
        }
    } else if (from_state == st_object_top) {
        if (saw_value == saw_stream) {
            QTC::TC("qpdf", "QPDF_json value stream both or neither");
            error(value.getStart(), "object must have exactly one of \"value\" or \"stream\"");
        }
        if (saw_stream) {
            if (!saw_dict) {
                QTC::TC("qpdf", "QPDF_json stream no dict");
                error(value.getStart(), "\"stream\" is missing \"dict\"");
            }
            if (saw_data == saw_datafile) {
                if (this_stream_needs_data) {
                    QTC::TC("qpdf", "QPDF_json data datafile both or neither");
                    error(
                        value.getStart(),
                        "new \"stream\" must have exactly one of \"data\" or \"datafile\"");
                } else if (saw_datafile) {
                    QTC::TC("qpdf", "QPDF_json data and datafile");
                    error(
                        value.getStart(),
                        "existing \"stream\" may at most one of \"data\" or \"datafile\"");
                } else {
                    QTC::TC("qpdf", "QPDF_json no stream data in update mode");
                }
            }
        }
    }
    if (!stack.empty()) {
        auto state = stack.back().state;
        if (state == st_objects) {
            this->cur_object = "";
            this->saw_dict = false;
            this->saw_data = false;
            this->saw_datafile = false;
            this->saw_value = false;
            this->saw_stream = false;
        }
    }
}